

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_remove(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  REF_ADJ_ITEM pRVar1;
  int iVar2;
  ulong uVar3;
  REF_STATUS RVar4;
  ulong uVar5;
  REF_INT RVar6;
  ulong uVar7;
  
  RVar4 = 3;
  if ((-1 < node) && (node < ref_adj->nnode)) {
    iVar2 = ref_adj->first[(uint)node];
    uVar3 = (ulong)iVar2;
    if (uVar3 != 0xffffffffffffffff) {
      pRVar1 = ref_adj->item;
      if (pRVar1[uVar3].ref == reference) {
        ref_adj->first[(uint)node] = pRVar1[uVar3].next;
        pRVar1[uVar3].next = ref_adj->blank;
        ref_adj->blank = iVar2;
LAB_0018fd51:
        pRVar1[uVar3].ref = -1;
        RVar4 = 0;
      }
      else {
        uVar7 = 0xffffffff;
        RVar6 = pRVar1[uVar3].ref;
        while (iVar2 = (int)uVar3, iVar2 != -1) {
          uVar5 = uVar3 & 0xffffffff;
          uVar3 = (ulong)iVar2;
          if (RVar6 == reference) {
            if ((int)uVar7 == -1) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c"
                     ,0xba,"ref_adj_remove",1,"parent empty");
              return 1;
            }
            pRVar1[(int)uVar7].next = pRVar1[uVar3].next;
            pRVar1[uVar3].next = ref_adj->blank;
            ref_adj->blank = iVar2;
            goto LAB_0018fd51;
          }
          uVar3 = (ulong)pRVar1[uVar3].next;
          uVar7 = uVar5;
          RVar6 = -1;
          if (uVar3 != 0xffffffffffffffff) {
            RVar6 = pRVar1[uVar3].ref;
          }
        }
      }
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_adj_remove(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT reference) {
  REF_INT item, ref;
  REF_INT target, parent;

  item = ref_adj_first(ref_adj, node);

  if (!ref_adj_valid(item)) return REF_INVALID;

  if (reference == ref_adj_item_ref(ref_adj, item)) {
    ref_adj->first[node] = ref_adj_item_next(ref_adj, item);
    ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
    ref_adj_blank(ref_adj) = item;
    ref_adj_item_ref(ref_adj, item) = REF_EMPTY;
    return REF_SUCCESS;
  }

  target = REF_EMPTY;
  parent = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      target = item;
      break;
    } else {
      parent = item;
    }
  }

  if (REF_EMPTY == target) return REF_INVALID;

  if (REF_EMPTY == parent) RSS(REF_FAILURE, "parent empty");

  ref_adj_item_next(ref_adj, parent) = ref_adj_item_next(ref_adj, item);
  ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = item;
  ref_adj_item_ref(ref_adj, item) = REF_EMPTY;

  return REF_SUCCESS;
}